

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_escaped_string<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,basic_string_view<char> str)

{
  iterator pcVar1;
  basic_appender<char> bVar2;
  buffer<char> *in_RDI;
  bool bVar3;
  find_escape_result<char> *in_stack_00000020;
  find_escape_result<char> escape;
  iterator end;
  iterator begin;
  basic_appender<char> in_stack_ffffffffffffff88;
  buffer<char> *in_stack_ffffffffffffff90;
  basic_appender<char> in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  iterator pcVar4;
  char *in_stack_ffffffffffffffc0;
  basic_appender<char> local_28;
  basic_string_view<char> local_20;
  basic_appender<char> local_10 [2];
  char c;
  
  local_10[0].container = in_RDI;
  local_28 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_28);
  basic_appender<char>::operator=
            ((basic_appender<char> *)in_stack_ffffffffffffff90,
             (char)((ulong)in_stack_ffffffffffffff88.container >> 0x38));
  basic_string_view<char>::begin(&local_20);
  pcVar1 = basic_string_view<char>::end(&local_20);
  do {
    find_escape(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_10[0] = copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88.container,
                             in_stack_ffffffffffffff98);
    if (in_stack_ffffffffffffffb8 == (iterator)0x0) break;
    pcVar4 = in_stack_ffffffffffffffb8;
    in_stack_ffffffffffffff98 =
         write_escaped_cp<fmt::v11::basic_appender<char>,char>
                   ((basic_appender<char>)escape.begin,in_stack_00000020);
    bVar3 = in_stack_ffffffffffffffb8 != pcVar1;
    in_stack_ffffffffffffff90 = local_10[0].container;
    in_stack_ffffffffffffffb8 = pcVar4;
    local_10[0] = in_stack_ffffffffffffff98;
  } while (bVar3);
  bVar2 = basic_appender<char>::operator++(local_10,0);
  c = (char)((ulong)bVar2.container >> 0x38);
  basic_appender<char>::operator*((basic_appender<char> *)&stack0xffffffffffffff88);
  basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffff90,c);
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}